

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGlobalUnixMakefileGenerator3.cxx
# Opt level: O2

void __thiscall
cmGlobalUnixMakefileGenerator3::AddCXXCompileCommand
          (cmGlobalUnixMakefileGenerator3 *this,string *sourceFile,string *workingDirectory,
          string *compileCommand)

{
  ostream *poVar1;
  char *pcVar2;
  cmGeneratedFileStream *this_00;
  string commandDatabaseName;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> bStack_88;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_68;
  string local_48;
  
  if (this->CommandDatabase == (cmGeneratedFileStream *)0x0) {
    pcVar2 = cmake::GetHomeOutputDirectory((this->super_cmGlobalGenerator).CMakeInstance);
    std::__cxx11::string::string((string *)&bStack_88,pcVar2,(allocator *)&local_48);
    std::operator+(&local_68,&bStack_88,"/compile_commands.json");
    std::__cxx11::string::~string((string *)&bStack_88);
    this_00 = (cmGeneratedFileStream *)operator_new(0x248);
    cmGeneratedFileStream::cmGeneratedFileStream(this_00,local_68._M_dataplus._M_p,false);
    this->CommandDatabase = this_00;
    poVar1 = std::operator<<((ostream *)this_00,"[");
    std::endl<char,std::char_traits<char>>(poVar1);
    std::__cxx11::string::~string((string *)&local_68);
  }
  else {
    poVar1 = std::operator<<((ostream *)this->CommandDatabase,",");
    std::endl<char,std::char_traits<char>>(poVar1);
  }
  poVar1 = std::operator<<((ostream *)this->CommandDatabase,"{");
  poVar1 = std::endl<char,std::char_traits<char>>(poVar1);
  poVar1 = std::operator<<(poVar1,"  \"directory\": \"");
  cmGlobalGenerator::EscapeJSON(&local_68,workingDirectory);
  poVar1 = std::operator<<(poVar1,(string *)&local_68);
  poVar1 = std::operator<<(poVar1,"\",");
  poVar1 = std::endl<char,std::char_traits<char>>(poVar1);
  poVar1 = std::operator<<(poVar1,"  \"command\": \"");
  cmGlobalGenerator::EscapeJSON(&bStack_88,compileCommand);
  poVar1 = std::operator<<(poVar1,(string *)&bStack_88);
  poVar1 = std::operator<<(poVar1,"\",");
  poVar1 = std::endl<char,std::char_traits<char>>(poVar1);
  poVar1 = std::operator<<(poVar1,"  \"file\": \"");
  cmGlobalGenerator::EscapeJSON(&local_48,sourceFile);
  poVar1 = std::operator<<(poVar1,(string *)&local_48);
  poVar1 = std::operator<<(poVar1,"\"");
  poVar1 = std::endl<char,std::char_traits<char>>(poVar1);
  std::operator<<(poVar1,"}");
  std::__cxx11::string::~string((string *)&local_48);
  std::__cxx11::string::~string((string *)&bStack_88);
  std::__cxx11::string::~string((string *)&local_68);
  return;
}

Assistant:

void cmGlobalUnixMakefileGenerator3::AddCXXCompileCommand(
    const std::string &sourceFile, const std::string &workingDirectory,
    const std::string &compileCommand) {
  if (this->CommandDatabase == NULL)
    {
    std::string commandDatabaseName =
      std::string(this->GetCMakeInstance()->GetHomeOutputDirectory())
      + "/compile_commands.json";
    this->CommandDatabase =
      new cmGeneratedFileStream(commandDatabaseName.c_str());
    *this->CommandDatabase << "[" << std::endl;
    } else {
    *this->CommandDatabase << "," << std::endl;
    }
  *this->CommandDatabase << "{" << std::endl
      << "  \"directory\": \""
      << cmGlobalGenerator::EscapeJSON(workingDirectory) << "\","
      << std::endl
      << "  \"command\": \"" <<
      cmGlobalGenerator::EscapeJSON(compileCommand) << "\","
      << std::endl
      << "  \"file\": \"" <<
      cmGlobalGenerator::EscapeJSON(sourceFile) << "\""
      << std::endl << "}";
}